

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  long *plVar4;
  mapped_type *pmVar5;
  long *plVar6;
  size_type *psVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  key_type_conflict local_f4;
  string local_f0;
  DescriptorBuilder *local_d0;
  EnumDescriptorProto *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x28) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0')) {
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_80._M_impl.super__Rb_tree_header._M_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d0 = this;
    local_c8 = proto;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < *(int *)(enm + 0x2c)) {
      lVar10 = 0;
      do {
        iVar3 = *(int *)(*(long *)(enm + 0x30) + 0x10 + lVar10 * 0x28);
        p_Var8 = &local_80._M_impl.super__Rb_tree_header._M_header;
        for (p_Var9 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < iVar3])
        {
          if (iVar3 <= (int)p_Var9[1]._M_color) {
            p_Var8 = p_Var9;
          }
        }
        p_Var2 = &local_80._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var2->_M_header;
        if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
           (p_Var9 = p_Var8, iVar3 < (int)p_Var8[1]._M_color)) {
          p_Var9 = &p_Var2->_M_header;
        }
        lVar1 = *(long *)(enm + 0x30) + lVar10 * 0x28;
        if ((_Rb_tree_header *)p_Var9 == p_Var2) {
          local_f0._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar1 + 0x10);
          pmVar5 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_80,(key_type_conflict *)&local_f0);
          std::__cxx11::string::_M_assign((string *)pmVar5);
        }
        else {
          std::operator+(&local_50,"\"",
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar1 + 8));
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_b0 = *plVar6;
            lStack_a8 = plVar4[3];
            local_c0 = &local_b0;
          }
          else {
            local_b0 = *plVar6;
            local_c0 = (long *)*plVar4;
          }
          local_b8 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_f4 = *(key_type_conflict *)(lVar1 + 0x10);
          pmVar5 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_80,&local_f4);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_c0,(ulong)(pmVar5->_M_dataplus)._M_p);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_90 = *plVar6;
            lStack_88 = plVar4[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar6;
            local_a0 = (long *)*plVar4;
          }
          local_98 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0.field_2._8_8_ = plVar4[3];
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = *psVar7;
            local_f0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_f0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_a0 != &local_90) {
            operator_delete(local_a0);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0') {
            AddError(local_d0,*(string **)(enm + 8),
                     (Message *)
                     ((local_c8->value_).super_RepeatedPtrFieldBase.rep_)->elements[lVar10],NUMBER,
                     &local_f0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < *(int *)(enm + 0x2c));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_80);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        std::string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] +
            "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, error);
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}